

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
               (IntegerDecimalCastData<long> *state)

{
  bool bVar1;
  int64_t *in_RDI;
  bool success;
  result_t tmp;
  int64_t *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  int64_t local_18;
  int64_t *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  bVar1 = TryCast::Operation<long,long>
                    (CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,false);
  if (bVar1) {
    while (10 < local_10[1]) {
      local_10[1] = local_10[1] / 10;
      *(short *)(local_10 + 2) = (short)local_10[2] + -1;
    }
    local_1 = true;
    if (((short)local_10[2] == 1) && (4 < local_10[1])) {
      local_1 = TrySubtractOperator::Operation<long,long,long>(local_18,1,&local_18);
    }
    *local_10 = local_18;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}